

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.c
# Opt level: O2

void Parse(void *yyp,int yymajor,int64_t yyminor,calculator_t *state)

{
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  byte *pbVar4;
  undefined8 uVar5;
  char *__format;
  byte *pbVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  
  *(calculator_t **)((long)yyp + 0x10) = state;
  if (*yyp == (byte *)0x0) {
    __assert_fail("yypParser->yytos!=0",
                  "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/build_O2/calculator.c"
                  ,0x524,"void Parse(void *, int, int64_t, calculator_t *)");
  }
  bVar2 = (byte)yymajor;
  bVar7 = **yyp;
  if (yyTraceFILE != (FILE *)0x0) {
    uVar9 = (ulong)bVar7;
    if (bVar7 < 0x48) {
      __format = "%sInput \'%s\' in state %d\n";
    }
    else {
      uVar9 = (ulong)(bVar7 - 0x48);
      __format = "%sInput \'%s\' with pending reduce %d\n";
    }
    fprintf((FILE *)yyTraceFILE,__format,yyTracePrompt,yyTokenName[yymajor],uVar9);
  }
  pbVar1 = (byte *)((long)yyp + 0x18);
  pbVar6 = *yyp;
  if (bVar7 != *pbVar6) {
    __assert_fail("yyact==yypParser->yytos->stateno",
                  "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/build_O2/calculator.c"
                  ,0x537,"void Parse(void *, int, int64_t, calculator_t *)");
  }
  if (bVar7 < 0x27) {
    if (bVar2 == 0x1a) {
      __assert_fail("iLookAhead!=YYNOCODE",
                    "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/build_O2/calculator.c"
                    ,0x2b8,"unsigned char yy_find_shift_action(unsigned char, unsigned char)");
    }
    if (0x17 < bVar2) {
      __assert_fail("iLookAhead < YYNTOKEN",
                    "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/build_O2/calculator.c"
                    ,0x2b9,"unsigned char yy_find_shift_action(unsigned char, unsigned char)");
    }
    lVar3 = (ulong)"LLLLLLLLLLLLLLLLLLLLLL"[bVar7] + ((ulong)(uint)yymajor & 0xff);
    if ("\x18\x01\x02\x03\x04\x05\x06\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x10\x11\x12\x16"[lVar3] ==
        bVar2) {
      if (0x7a < (uint)lVar3) {
        __assert_fail("i>=0 && i<(int)(sizeof(yy_action)/sizeof(yy_action[0]))",
                      "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/build_O2/calculator.c"
                      ,0x2df,"unsigned char yy_find_shift_action(unsigned char, unsigned char)");
      }
      pbVar4 = "\x16\x05\x04\b\a\x06\n\t\x0e\r\f\v\x10\x0f\x15\x14\x13\x12\x11\x13\x12\x11CH\x05\x04\b\a\x06\n\t\x0e\r\f\v\x10\x0f\x15\x14\x13\x12\x11\b\a\x06\n\t\x0e\r\f\v\x10\x0f\x15\x14\x13\x12\x11\n\t\x0e\r\f\v\x10\x0f\x15\x14\x13\x12\x11\x0e\r\f\v\x10\x0f\x15\x14\x13\x12\x11\x10\x0f\x15\x14\x13\x12\x11\x15\x14\x13\x12\x11G\x02\x03\x01\\DG\x17F[\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$MLGK%&"
               + lVar3;
    }
    else {
      pbVar4 = "EEEEEEEEEEEEEEEEEEEEEEEEZYXWVUTSRQPONJI" + bVar7;
    }
    bVar7 = *pbVar4;
  }
  if (0x47 < bVar7) {
    uVar8 = bVar7 - 0x48;
    if (0x16 < uVar8) {
      __assert_fail("yyruleno<(int)(sizeof(yyRuleName)/sizeof(yyRuleName[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/build_O2/calculator.c"
                    ,0x3a9,"unsigned char yy_reduce(yyParser *, unsigned int, int, int64_t)");
    }
    if (yyTraceFILE != (FILE *)0x0) {
      fprintf((FILE *)yyTraceFILE,"%sReduce %d [%s]%s, pop back to state %d.\n",yyTracePrompt,
              (ulong)uVar8,yyRuleName_rel + *(int *)(yyRuleName_rel + (ulong)uVar8 * 4),"",
              (uint)pbVar6[(long)yyRuleInfoNRhs[uVar8] * 0x10]);
    }
    (*(code *)(&DAT_00103380 + *(int *)(&DAT_00103380 + (ulong)uVar8 * 4)))();
    return;
  }
  if (bVar7 < 0x45) {
    *(byte **)yyp = pbVar6 + 0x10;
    if (*(byte **)((long)yyp + 0x658) < pbVar6 + 0x10) {
      *(byte **)yyp = pbVar6;
      uVar5 = *(undefined8 *)((long)yyp + 0x10);
      if (yyTraceFILE != (FILE *)0x0) {
        fprintf((FILE *)yyTraceFILE,"%sStack Overflow!\n",yyTracePrompt);
      }
      while (pbVar1 < *yyp) {
        yy_pop_parser_stack((yyParser *)yyp);
      }
      *(undefined8 *)((long)yyp + 0x10) = uVar5;
    }
    else {
      if (0x26 < bVar7) {
        bVar7 = bVar7 + 0x1a;
      }
      pbVar6[0x10] = bVar7;
      pbVar6[0x11] = bVar2;
      *(int64_t *)(pbVar6 + 0x18) = yyminor;
      yyTraceShift((yyParser *)yyp,(uint)bVar7,"Shift");
    }
    *(int *)((long)yyp + 8) = *(int *)((long)yyp + 8) + -1;
  }
  else {
    if (bVar7 != 0x45) {
      if (bVar7 != 0x46) {
        __assert_fail("yyact == YY_ERROR_ACTION",
                      "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/build_O2/calculator.c"
                      ,0x547,"void Parse(void *, int, int64_t, calculator_t *)");
      }
      pbVar6 = pbVar6 + -0x10;
      *(byte **)yyp = pbVar6;
      uVar5 = *(undefined8 *)((long)yyp + 0x10);
      if (yyTraceFILE != (FILE *)0x0) {
        fprintf((FILE *)yyTraceFILE,"%sAccept!\n",yyTracePrompt);
        pbVar6 = *yyp;
      }
      *(undefined4 *)((long)yyp + 8) = 0xffffffff;
      if (pbVar6 == pbVar1) {
        *(undefined8 *)((long)yyp + 0x10) = uVar5;
        return;
      }
      __assert_fail("yypParser->yytos==yypParser->yystack",
                    "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/build_O2/calculator.c"
                    ,0x4f6,"void yy_accept(yyParser *)");
    }
    if (yyTraceFILE != (FILE *)0x0) {
      fprintf((FILE *)yyTraceFILE,"%sSyntax Error!\n",yyTracePrompt);
    }
    if (*(int *)((long)yyp + 8) < 1) {
      *(undefined4 *)(*(long *)((long)yyp + 0x10) + 8) = 1;
    }
    *(undefined4 *)((long)yyp + 8) = 3;
    if (yymajor == 0) {
      uVar5 = *(undefined8 *)((long)yyp + 0x10);
      if (yyTraceFILE != (FILE *)0x0) {
        fprintf((FILE *)yyTraceFILE,"%sFail!\n",yyTracePrompt);
      }
      while (pbVar1 < *yyp) {
        yy_pop_parser_stack((yyParser *)yyp);
      }
      *(undefined8 *)((long)yyp + 0x10) = uVar5;
      *(undefined4 *)((long)yyp + 8) = 0xffffffff;
    }
  }
  if (yyTraceFILE == (FILE *)0x0) {
    return;
  }
  fprintf((FILE *)yyTraceFILE,"%sReturn. Stack=",yyTracePrompt);
  uVar5 = 0x5b;
  for (uVar9 = (long)yyp + 0x28; uVar9 <= *yyp; uVar9 = uVar9 + 0x10) {
    fprintf((FILE *)yyTraceFILE,"%c%s",uVar5,yyTokenName[*(byte *)(uVar9 + 1)]);
    uVar5 = 0x20;
  }
  fwrite("]\n",2,1,(FILE *)yyTraceFILE);
  return;
}

Assistant:

void Parse(
  void *yyp,                   /* The parser */
  int yymajor,                 /* The major token code number */
  ParseTOKENTYPE yyminor       /* The value for the token */
  ParseARG_PDECL               /* Optional %extra_argument parameter */
){
  YYMINORTYPE yyminorunion;
  YYACTIONTYPE yyact;   /* The parser action. */
#if !defined(YYERRORSYMBOL) && !defined(YYNOERRORRECOVERY)
  int yyendofinput;     /* True if we are at the end of input */
#endif
#ifdef YYERRORSYMBOL
  int yyerrorhit = 0;   /* True if yymajor has invoked an error */
#endif
  yyParser *yypParser = (yyParser*)yyp;  /* The parser */
  ParseCTX_FETCH
  ParseARG_STORE

  assert( yypParser->yytos!=0 );
#if !defined(YYERRORSYMBOL) && !defined(YYNOERRORRECOVERY)
  yyendofinput = (yymajor==0);
#endif

  yyact = yypParser->yytos->stateno;
#ifndef NDEBUG
  if( yyTraceFILE ){
    if( yyact < YY_MIN_REDUCE ){
      fprintf(yyTraceFILE,"%sInput '%s' in state %d\n",
              yyTracePrompt,yyTokenName[yymajor],yyact);
    }else{
      fprintf(yyTraceFILE,"%sInput '%s' with pending reduce %d\n",
              yyTracePrompt,yyTokenName[yymajor],yyact-YY_MIN_REDUCE);
    }
  }
#endif

  do{
    assert( yyact==yypParser->yytos->stateno );
    yyact = yy_find_shift_action((YYCODETYPE)yymajor,yyact);
    if( yyact >= YY_MIN_REDUCE ){
      yyact = yy_reduce(yypParser,yyact-YY_MIN_REDUCE,yymajor,
                        yyminor ParseCTX_PARAM);
    }else if( yyact <= YY_MAX_SHIFTREDUCE ){
      yy_shift(yypParser,yyact,(YYCODETYPE)yymajor,yyminor);
#ifndef YYNOERRORRECOVERY
      yypParser->yyerrcnt--;
#endif
      break;
    }else if( yyact==YY_ACCEPT_ACTION ){
      yypParser->yytos--;
      yy_accept(yypParser);
      return;
    }else{
      assert( yyact == YY_ERROR_ACTION );
      yyminorunion.yy0 = yyminor;
#ifdef YYERRORSYMBOL
      int yymx;
#endif
#ifndef NDEBUG
      if( yyTraceFILE ){
        fprintf(yyTraceFILE,"%sSyntax Error!\n",yyTracePrompt);
      }
#endif
#ifdef YYERRORSYMBOL
      /* A syntax error has occurred.
      ** The response to an error depends upon whether or not the
      ** grammar defines an error token "ERROR".  
      **
      ** This is what we do if the grammar does define ERROR:
      **
      **  * Call the %syntax_error function.
      **
      **  * Begin popping the stack until we enter a state where
      **    it is legal to shift the error symbol, then shift
      **    the error symbol.
      **
      **  * Set the error count to three.
      **
      **  * Begin accepting and shifting new tokens.  No new error
      **    processing will occur until three tokens have been
      **    shifted successfully.
      **
      */
      if( yypParser->yyerrcnt<0 ){
        yy_syntax_error(yypParser,yymajor,yyminor);
      }
      yymx = yypParser->yytos->major;
      if( yymx==YYERRORSYMBOL || yyerrorhit ){
#ifndef NDEBUG
        if( yyTraceFILE ){
          fprintf(yyTraceFILE,"%sDiscard input token %s\n",
             yyTracePrompt,yyTokenName[yymajor]);
        }
#endif
        yy_destructor(yypParser, (YYCODETYPE)yymajor, &yyminorunion);
        yymajor = YYNOCODE;
      }else{
        while( yypParser->yytos >= yypParser->yystack
            && (yyact = yy_find_reduce_action(
                        yypParser->yytos->stateno,
                        YYERRORSYMBOL)) > YY_MAX_SHIFTREDUCE
        ){
          yy_pop_parser_stack(yypParser);
        }
        if( yypParser->yytos < yypParser->yystack || yymajor==0 ){
          yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
          yy_parse_failed(yypParser);
#ifndef YYNOERRORRECOVERY
          yypParser->yyerrcnt = -1;
#endif
          yymajor = YYNOCODE;
        }else if( yymx!=YYERRORSYMBOL ){
          yy_shift(yypParser,yyact,YYERRORSYMBOL,yyminor);
        }
      }
      yypParser->yyerrcnt = 3;
      yyerrorhit = 1;
      if( yymajor==YYNOCODE ) break;
      yyact = yypParser->yytos->stateno;
#elif defined(YYNOERRORRECOVERY)
      /* If the YYNOERRORRECOVERY macro is defined, then do not attempt to
      ** do any kind of error recovery.  Instead, simply invoke the syntax
      ** error routine and continue going as if nothing had happened.
      **
      ** Applications can set this macro (for example inside %include) if
      ** they intend to abandon the parse upon the first syntax error seen.
      */
      yy_syntax_error(yypParser,yymajor, yyminor);
      yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
      break;
#else  /* YYERRORSYMBOL is not defined */
      /* This is what we do if the grammar does not define ERROR:
      **
      **  * Report an error message, and throw away the input token.
      **
      **  * If the input token is $, then fail the parse.
      **
      ** As before, subsequent error messages are suppressed until
      ** three input tokens have been successfully shifted.
      */
      if( yypParser->yyerrcnt<=0 ){
        yy_syntax_error(yypParser,yymajor, yyminor);
      }
      yypParser->yyerrcnt = 3;
      yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
      if( yyendofinput ){
        yy_parse_failed(yypParser);
#ifndef YYNOERRORRECOVERY
        yypParser->yyerrcnt = -1;
#endif
      }
      break;
#endif
    }
  }while( yypParser->yytos>yypParser->yystack );
#ifndef NDEBUG
  if( yyTraceFILE ){
    yyStackEntry *i;
    char cDiv = '[';
    fprintf(yyTraceFILE,"%sReturn. Stack=",yyTracePrompt);
    for(i=&yypParser->yystack[1]; i<=yypParser->yytos; i++){
      fprintf(yyTraceFILE,"%c%s", cDiv, yyTokenName[i->major]);
      cDiv = ' ';
    }
    fprintf(yyTraceFILE,"]\n");
  }
#endif
  return;
}